

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O1

void __thiscall ScriptOperator_ToCodeString_Test::TestBody(ScriptOperator_ToCodeString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AssertHelper AStack_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_20 [16];
  
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_MIN.ToCodeString().c_str()","\"OP_MIN\"",
             (char *)local_30[0].ptr_,"OP_MIN");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_3.ToCodeString().c_str()","\"OP_3\"",
             (char *)local_30[0].ptr_,"OP_3");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_0.ToCodeString().c_str()","\"OP_0\"",
             (char *)local_30[0].ptr_,"OP_0");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_1.ToCodeString().c_str()","\"OP_1\"",
             (char *)local_30[0].ptr_,"OP_1");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_16.ToCodeString().c_str()","\"OP_16\"",
             (char *)local_30[0].ptr_,"OP_16");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_TRUE.ToCodeString().c_str()","\"OP_TRUE\"",
             (char *)local_30[0].ptr_,"OP_TRUE");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_FALSE.ToCodeString().c_str()","\"OP_FALSE\"",
             (char *)local_30[0].ptr_,"OP_FALSE");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptOperator::ToCodeString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            (local_40,"ScriptOperator::OP_1NEGATE.ToCodeString().c_str()","\"OP_1NEGATE\"",
             (char *)local_30[0].ptr_,"OP_1NEGATE");
  if (local_30[0].ptr_ != local_20) {
    operator_delete(local_30[0].ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptoperator.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if (local_30[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_30[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30[0].ptr_ + 8))();
      }
      local_30[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(ScriptOperator, ToCodeString) {
  EXPECT_STREQ(ScriptOperator::OP_MIN.ToCodeString().c_str(), "OP_MIN");
  EXPECT_STREQ(ScriptOperator::OP_3.ToCodeString().c_str(), "OP_3");
  EXPECT_STREQ(ScriptOperator::OP_0.ToCodeString().c_str(), "OP_0");
  EXPECT_STREQ(ScriptOperator::OP_1.ToCodeString().c_str(), "OP_1");
  EXPECT_STREQ(ScriptOperator::OP_16.ToCodeString().c_str(), "OP_16");
  EXPECT_STREQ(ScriptOperator::OP_TRUE.ToCodeString().c_str(), "OP_TRUE");
  EXPECT_STREQ(ScriptOperator::OP_FALSE.ToCodeString().c_str(), "OP_FALSE");
  EXPECT_STREQ(ScriptOperator::OP_1NEGATE.ToCodeString().c_str(), "OP_1NEGATE");
}